

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm.cpp
# Opt level: O0

void wasm::
     removeModuleElements<std::vector<std::unique_ptr<wasm::Table,std::default_delete<wasm::Table>>,std::allocator<std::unique_ptr<wasm::Table,std::default_delete<wasm::Table>>>>,std::unordered_map<wasm::Name,wasm::Table*,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,wasm::Table*>>>,wasm::Table>
               (vector<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
                *v,unordered_map<wasm::Name,_wasm::Table_*,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Table_*>_>_>
                   *m,function<bool_(wasm::Table_*)> *pred)

{
  bool bVar1;
  pointer ppVar2;
  __normal_iterator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_*,_std::vector<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>_>
  local_80;
  const_iterator local_78;
  function<bool_(wasm::Table_*)> *local_70;
  unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_> *local_68;
  __normal_iterator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_*,_std::vector<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>_>
  local_60;
  __normal_iterator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_*,_std::vector<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>_>
  local_58;
  const_iterator local_50;
  _Node_iterator_base<std::pair<const_wasm::Name,_wasm::Table_*>,_true> local_48;
  _Node_iterator_base<std::pair<const_wasm::Name,_wasm::Table_*>,_true> local_40;
  _Node_iterator_base<std::pair<const_wasm::Name,_wasm::Table_*>,_true> local_38;
  _Node_iterator_base<std::pair<const_wasm::Name,_wasm::Table_*>,_true> local_30;
  _Node_iterator_base<std::pair<const_wasm::Name,_wasm::Table_*>,_true> local_28;
  iterator it;
  function<bool_(wasm::Table_*)> *pred_local;
  unordered_map<wasm::Name,_wasm::Table_*,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Table_*>_>_>
  *m_local;
  vector<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
  *v_local;
  
  it.super__Node_iterator_base<std::pair<const_wasm::Name,_wasm::Table_*>,_true>._M_cur =
       (_Node_iterator_base<std::pair<const_wasm::Name,_wasm::Table_*>,_true>)
       (_Node_iterator_base<std::pair<const_wasm::Name,_wasm::Table_*>,_true>)pred;
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<wasm::Name,_wasm::Table_*,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Table_*>_>_>
       ::begin(m);
  while( true ) {
    local_30._M_cur =
         (__node_type *)
         std::
         unordered_map<wasm::Name,_wasm::Table_*,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Table_*>_>_>
         ::end(m);
    bVar1 = std::__detail::operator!=(&local_28,&local_30);
    if (!bVar1) break;
    ppVar2 = std::__detail::_Node_iterator<std::pair<const_wasm::Name,_wasm::Table_*>,_false,_true>
             ::operator->((_Node_iterator<std::pair<const_wasm::Name,_wasm::Table_*>,_false,_true> *
                          )&local_28);
    bVar1 = std::function<bool_(wasm::Table_*)>::operator()(pred,ppVar2->second);
    if (bVar1) {
      local_40._M_cur = local_28._M_cur;
      local_38._M_cur =
           (__node_type *)
           std::
           unordered_map<wasm::Name,_wasm::Table_*,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Table_*>_>_>
           ::erase(m,local_28._M_cur);
      local_28._M_cur = local_38._M_cur;
    }
    else {
      local_48._M_cur =
           (__node_type *)
           std::__detail::_Node_iterator<std::pair<const_wasm::Name,_wasm::Table_*>,_false,_true>::
           operator++((_Node_iterator<std::pair<const_wasm::Name,_wasm::Table_*>,_false,_true> *)
                      &local_28,0);
    }
  }
  local_60._M_current =
       (unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_> *)
       std::
       vector<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
       ::begin(v);
  local_68 = (unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_> *)
             std::
             vector<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
             ::end(v);
  local_70 = pred;
  local_58 = std::
             remove_if<__gnu_cxx::__normal_iterator<std::unique_ptr<wasm::Table,std::default_delete<wasm::Table>>*,std::vector<std::unique_ptr<wasm::Table,std::default_delete<wasm::Table>>,std::allocator<std::unique_ptr<wasm::Table,std::default_delete<wasm::Table>>>>>,wasm::removeModuleElements<std::vector<std::unique_ptr<wasm::Table,std::default_delete<wasm::Table>>,std::allocator<std::unique_ptr<wasm::Table,std::default_delete<wasm::Table>>>>,std::unordered_map<wasm::Name,wasm::Table*,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,wasm::Table*>>>,wasm::Table>(std::vector<std::unique_ptr<wasm::Table,std::default_delete<wasm::Table>>,std::allocator<std::unique_ptr<wasm::Table,std::default_delete<wasm::Table>>>>&,std::unordered_map<wasm::Name,wasm::Table*,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,wasm::Table*>>>&,std::function<bool(wasm::Table*)>)::_lambda(auto:1&)_1_>
                       (local_60,(__normal_iterator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_*,_std::vector<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>_>
                                  )local_68,(anon_class_8_1_89904f1f_for__M_pred)pred);
  __gnu_cxx::
  __normal_iterator<std::unique_ptr<wasm::Table,std::default_delete<wasm::Table>>const*,std::vector<std::unique_ptr<wasm::Table,std::default_delete<wasm::Table>>,std::allocator<std::unique_ptr<wasm::Table,std::default_delete<wasm::Table>>>>>
  ::__normal_iterator<std::unique_ptr<wasm::Table,std::default_delete<wasm::Table>>*>
            ((__normal_iterator<std::unique_ptr<wasm::Table,std::default_delete<wasm::Table>>const*,std::vector<std::unique_ptr<wasm::Table,std::default_delete<wasm::Table>>,std::allocator<std::unique_ptr<wasm::Table,std::default_delete<wasm::Table>>>>>
              *)&local_50,&local_58);
  local_80._M_current =
       (unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_> *)
       std::
       vector<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
       ::end(v);
  __gnu_cxx::
  __normal_iterator<std::unique_ptr<wasm::Table,std::default_delete<wasm::Table>>const*,std::vector<std::unique_ptr<wasm::Table,std::default_delete<wasm::Table>>,std::allocator<std::unique_ptr<wasm::Table,std::default_delete<wasm::Table>>>>>
  ::__normal_iterator<std::unique_ptr<wasm::Table,std::default_delete<wasm::Table>>*>
            ((__normal_iterator<std::unique_ptr<wasm::Table,std::default_delete<wasm::Table>>const*,std::vector<std::unique_ptr<wasm::Table,std::default_delete<wasm::Table>>,std::allocator<std::unique_ptr<wasm::Table,std::default_delete<wasm::Table>>>>>
              *)&local_78,&local_80);
  std::
  vector<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
  ::erase(v,local_50,local_78);
  return;
}

Assistant:

void removeModuleElements(Vector& v,
                          Map& m,
                          std::function<bool(Elem* elem)> pred) {
  for (auto it = m.begin(); it != m.end();) {
    if (pred(it->second)) {
      it = m.erase(it);
    } else {
      it++;
    }
  }
  v.erase(
    std::remove_if(v.begin(), v.end(), [&](auto& e) { return pred(e.get()); }),
    v.end());
}